

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O3

bool __thiscall GGSock::FileServer::clearAllFiles(FileServer *this)

{
  ulong *puVar1;
  long lVar2;
  pointer pFVar3;
  void *pvVar4;
  pointer pcVar5;
  byte bVar6;
  int iVar7;
  _Head_base<0UL,_GGSock::FileServer::Impl_*,_false> _Var8;
  uint uVar9;
  pthread_mutex_t *__mutex;
  char *__end;
  pointer this_00;
  long *local_98 [2];
  long local_88 [2];
  TFilesize local_78;
  long *local_70 [2];
  long local_60 [2];
  int32_t local_50;
  void *local_48;
  pointer pcStack_40;
  pointer local_38;
  
  __mutex = (pthread_mutex_t *)
            &((this->m_impl)._M_t.
              super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
              .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->mutex;
  iVar7 = pthread_mutex_lock(__mutex);
  if (iVar7 != 0) {
    std::__throw_system_error(iVar7);
  }
  _Var8._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
       .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
  (_Var8._M_head_impl)->currentFileUpdateId = 0;
  lVar2 = *(long *)&((_Var8._M_head_impl)->fileUsed).super__Bvector_base<std::allocator<bool>_>;
  iVar7 = (*(int *)&((_Bit_iterator *)((long)&(_Var8._M_head_impl)->fileUsed + 0x10))->
                    super__Bit_iterator_base - (int)lVar2) * 8 +
          *(uint *)((long)&(_Var8._M_head_impl)->fileUsed + 0x18);
  if (0 < iVar7) {
    uVar9 = 0;
    do {
      bVar6 = (byte)uVar9 & 0x3f;
      puVar1 = (ulong *)(lVar2 + (ulong)(uVar9 >> 6) * 8);
      *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
      uVar9 = uVar9 + 1;
    } while ((int)uVar9 < iVar7);
  }
  this_00 = *(pointer *)
             &((_Var8._M_head_impl)->files).
              super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
  ;
  pFVar3 = *(pointer *)((long)&(_Var8._M_head_impl)->files + 8);
  if (this_00 != pFVar3) {
    do {
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"?","");
      local_78 = 0;
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"?","");
      local_50 = 0;
      local_48 = (void *)0x0;
      pcStack_40 = (pointer)0x0;
      local_38 = (pointer)0x0;
      std::__cxx11::string::operator=((string *)this_00,(string *)local_98);
      *(TFilesize *)((long)&this_00->info + 0x20) = local_78;
      std::__cxx11::string::operator=((string *)((long)&this_00->info + 0x28),(string *)local_70);
      *(int32_t *)((long)&this_00->info + 0x48) = local_50;
      pvVar4 = *(void **)&(this_00->data).super__Vector_base<char,_std::allocator<char>_>;
      pcVar5 = *(pointer *)((long)&this_00->data + 0x10);
      *(void **)&(this_00->data).super__Vector_base<char,_std::allocator<char>_> = local_48;
      *(pointer *)((long)&this_00->data + 8) = pcStack_40;
      *(pointer *)((long)&this_00->data + 0x10) = local_38;
      local_38 = (pointer)0x0;
      local_48 = (void *)0x0;
      pcStack_40 = (pointer)0x0;
      if ((pvVar4 != (void *)0x0) &&
         (operator_delete(pvVar4,(long)pcVar5 - (long)pvVar4), local_48 != (void *)0x0)) {
        operator_delete(local_48,(long)local_38 - (long)local_48);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      if (local_98[0] != local_88) {
        operator_delete(local_98[0],local_88[0] + 1);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pFVar3);
    _Var8._M_head_impl =
         (this->m_impl)._M_t.
         super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
         .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
  }
  (_Var8._M_head_impl)->changedFileInfos = true;
  pthread_mutex_unlock(__mutex);
  return true;
}

Assistant:

bool FileServer::clearAllFiles() {
    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);

        m_impl->currentFileUpdateId = 0;
        for (int i = 0; i < (int) m_impl->fileUsed.size(); ++i) {
            m_impl->fileUsed[i] = false;
        }

        for (auto & file : m_impl->files) {
            file = {};
        }

        m_impl->changedFileInfos = true;
    }

    return true;
}